

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O3

int xmlNanoHTTPFetch(char *URL,char *filename,char **contentType)

{
  int __fd;
  xmlNanoHTTPCtxtPtr ctxt_00;
  ssize_t sVar1;
  int iVar2;
  xmlNanoHTTPCtxtPtr ctxt;
  char *buf;
  int len;
  char *local_38;
  int local_2c;
  
  local_38 = (char *)0x0;
  iVar2 = -1;
  if ((filename != (char *)0x0) &&
     (ctxt_00 = (xmlNanoHTTPCtxtPtr)xmlNanoHTTPOpen(URL,contentType),
     ctxt_00 != (xmlNanoHTTPCtxtPtr)0x0)) {
    if ((*filename == '-') && (filename[1] == '\0')) {
      __fd = 0;
    }
    else {
      __fd = open64(filename,0x41,0x1a4);
      if (__fd < 0) {
        xmlNanoHTTPFreeCtxt(ctxt_00);
        if (contentType == (char **)0x0) {
          return -1;
        }
        if (*contentType == (char *)0x0) {
          return -1;
        }
        (*xmlFree)(*contentType);
        *contentType = (char *)0x0;
        return -1;
      }
    }
    xmlNanoHTTPFetchContent(ctxt_00,&local_38,&local_2c);
    if ((long)local_2c < 1) {
      iVar2 = 0;
    }
    else {
      sVar1 = write(__fd,local_38,(long)local_2c);
      iVar2 = -(uint)(sVar1 == -1);
    }
    xmlNanoHTTPFreeCtxt(ctxt_00);
    close(__fd);
  }
  return iVar2;
}

Assistant:

int
xmlNanoHTTPFetch(const char *URL, const char *filename, char **contentType) {
    void *ctxt = NULL;
    char *buf = NULL;
    int fd;
    int len;
    int ret = 0;

    if (filename == NULL) return(-1);
    ctxt = xmlNanoHTTPOpen(URL, contentType);
    if (ctxt == NULL) return(-1);

    if (!strcmp(filename, "-"))
        fd = 0;
    else {
        fd = open(filename, O_CREAT | O_WRONLY, 00644);
	if (fd < 0) {
	    xmlNanoHTTPClose(ctxt);
	    if ((contentType != NULL) && (*contentType != NULL)) {
	        xmlFree(*contentType);
		*contentType = NULL;
	    }
	    return(-1);
	}
    }

    xmlNanoHTTPFetchContent( ctxt, &buf, &len );
    if ( len > 0 ) {
	if (write(fd, buf, len) == -1) {
	    ret = -1;
	}
    }

    xmlNanoHTTPClose(ctxt);
    close(fd);
    return(ret);
}